

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O1

void __thiscall TileWire::updateWire(TileWire *this,State state)

{
  undefined1 *puVar1;
  long lVar2;
  long lVar3;
  
  if (this->_type == CROSSOVER) {
    if (this->_updateTimestamp1 != Tile::currentUpdateTime) {
      (*(this->super_Tile)._vptr_Tile[9])(this,0,state);
    }
    lVar3 = 1;
    if (this->_updateTimestamp2 != Tile::currentUpdateTime) {
LAB_0013d2e2:
      (*(this->super_Tile)._vptr_Tile[9])(this,lVar3,state);
      return;
    }
  }
  else {
    puVar1 = &(&this->super_Tile)[(long)(int)(this->super_Tile)._direction * 2].field_0x21 +
             (long)(int)this->_type * 0x10;
    lVar3 = 0;
    do {
      lVar2 = 0;
      do {
        if (puVar1[lVar2] == '\x01') goto LAB_0013d2e2;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 4);
      lVar3 = lVar3 + 1;
      puVar1 = puVar1 + 4;
    } while (lVar3 != 4);
  }
  return;
}

Assistant:

void TileWire::updateWire(State state) {
    if (_type == CROSSOVER) {
        if (_updateTimestamp1 != Tile::currentUpdateTime) {    // For crossover, check both paths for update time mismatch.
            followWire(NORTH, state);
        }
        if (_updateTimestamp2 != Tile::currentUpdateTime) {
            followWire(EAST, state);
        }
    } else {
        for (int i = 0; i < 4; ++i) {    // Check combinations of entry and exit directions through this wire until one works out.
            const bool* exitDirections = CONNECTION_INFO[_direction][_type][i];
            for (int j = 0; j < 4; ++j) {
                if (exitDirections[j] == true) {
                    followWire(static_cast<Direction>(i), state);
                    return;
                }
            }
        }
    }
}